

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argument.hpp
# Opt level: O2

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
boost::runtime::arguments_store::
get<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
          (arguments_store *this,cstring *parameter_name)

{
  iterator iVar1;
  type paVar2;
  type paVar3;
  argument_ptr arg;
  shared_ptr<boost::runtime::argument> local_c8;
  undefined **local_b8;
  iterator local_b0;
  iterator local_a8;
  _Alloc_hider local_a0;
  size_type local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90;
  access_to_missing_argument local_80;
  access_to_missing_argument local_48;
  
  iVar1 = std::
          _Rb_tree<boost::unit_test::basic_cstring<const_char>,_std::pair<const_boost::unit_test::basic_cstring<const_char>,_boost::shared_ptr<boost::runtime::argument>_>,_std::_Select1st<std::pair<const_boost::unit_test::basic_cstring<const_char>,_boost::shared_ptr<boost::runtime::argument>_>_>,_std::less<boost::unit_test::basic_cstring<const_char>_>,_std::allocator<std::pair<const_boost::unit_test::basic_cstring<const_char>,_boost::shared_ptr<boost::runtime::argument>_>_>_>
          ::find((_Rb_tree<boost::unit_test::basic_cstring<const_char>,_std::pair<const_boost::unit_test::basic_cstring<const_char>,_boost::shared_ptr<boost::runtime::argument>_>,_std::_Select1st<std::pair<const_boost::unit_test::basic_cstring<const_char>,_boost::shared_ptr<boost::runtime::argument>_>_>,_std::less<boost::unit_test::basic_cstring<const_char>_>,_std::allocator<std::pair<const_boost::unit_test::basic_cstring<const_char>,_boost::shared_ptr<boost::runtime::argument>_>_>_>
                  *)this,parameter_name);
  if ((_Rb_tree_header *)iVar1._M_node == &(this->m_arguments)._M_t._M_impl.super__Rb_tree_header) {
    local_a0._M_p = (pointer)&local_90;
    local_b0 = "";
    local_a8 = "";
    local_98 = 0;
    local_90._M_local_buf[0] = '\0';
    local_b8 = &PTR__param_error_001e0938;
    specific_param_error<boost::runtime::access_to_missing_argument,_boost::runtime::init_error>::
    operator<<(&local_80,
               (specific_param_error<boost::runtime::access_to_missing_argument,_boost::runtime::init_error>
                *)&local_b8,"There is no argument provided for parameter ");
    specific_param_error<boost::runtime::access_to_missing_argument,boost::runtime::init_error>::
    operator<<(&local_48,
               (specific_param_error<boost::runtime::access_to_missing_argument,boost::runtime::init_error>
                *)&local_80,parameter_name);
    unit_test::ut_detail::throw_exception<boost::runtime::access_to_missing_argument>(&local_48);
  }
  local_c8.px = (element_type *)iVar1._M_node[1]._M_left;
  local_c8.pn.pi_ = (sp_counted_base *)iVar1._M_node[1]._M_right;
  if ((_Base_ptr)local_c8.pn.pi_ != (_Base_ptr)0x0) {
    LOCK();
    *(int *)&((_Base_ptr)local_c8.pn.pi_)->_M_parent =
         *(int *)&((_Base_ptr)local_c8.pn.pi_)->_M_parent + 1;
    UNLOCK();
  }
  paVar2 = shared_ptr<boost::runtime::argument>::operator->(&local_c8);
  if ((undefined1 *)paVar2->p_value_type ==
      &rtti::rtti_detail::
       rttid_holder<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>::inst()
       ::s_inst_abi_cxx11_) {
    paVar3 = shared_ptr<boost::runtime::argument>::operator*(&local_c8);
    detail::shared_count::~shared_count(&local_c8.pn);
    return (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)(paVar3 + 1);
  }
  local_a0._M_p = (pointer)&local_90;
  local_b0 = "";
  local_a8 = "";
  local_98 = 0;
  local_90._M_local_buf[0] = '\0';
  local_b8 = &PTR__param_error_001e1930;
  specific_param_error<boost::runtime::arg_type_mismatch,_boost::runtime::init_error>::operator<<
            ((arg_type_mismatch *)&local_80,
             (specific_param_error<boost::runtime::arg_type_mismatch,_boost::runtime::init_error> *)
             &local_b8,"Access with invalid type for argument corresponding to parameter ");
  specific_param_error<boost::runtime::arg_type_mismatch,boost::runtime::init_error>::operator<<
            ((arg_type_mismatch *)&local_48,
             (specific_param_error<boost::runtime::arg_type_mismatch,boost::runtime::init_error> *)
             &local_80,parameter_name);
  unit_test::ut_detail::throw_exception<boost::runtime::arg_type_mismatch>
            ((arg_type_mismatch *)&local_48);
}

Assistant:

T&          get( cstring parameter_name ) {
        storage_type::const_iterator found = m_arguments.find( parameter_name );
        BOOST_TEST_I_ASSRT( found != m_arguments.end(),
                            access_to_missing_argument() 
                                << "There is no argument provided for parameter "
                                << parameter_name );

        argument_ptr arg = found->second;

        BOOST_TEST_I_ASSRT( arg->p_value_type == rtti::type_id<T>(),
                            arg_type_mismatch()
                                << "Access with invalid type for argument corresponding to parameter "
                                << parameter_name );

        return static_cast<typed_argument<T>&>( *arg ).p_value.value;
    }